

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall
APITests::_test_events
          (APITests *this,int init,Edge edge,
          vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *tests,
          bool specify_callback,bool use_add_callback)

{
  int iVar1;
  _Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *p_Var2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  pointer ppVar7;
  bool use_add_callback_local;
  bool specify_callback_local;
  bool event_callback_occurred;
  pointer local_128;
  APITests *local_120;
  _Any_data local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  code *local_f8;
  undefined8 local_f0;
  code *local_e8;
  code *local_e0;
  TestCallback callback;
  anon_class_32_4_ee1f9acd get_saw_event;
  string local_90;
  string local_70;
  string local_50;
  _Any_data *p_Var6;
  
  event_callback_occurred = false;
  use_add_callback_local = use_add_callback;
  specify_callback_local = specify_callback;
  local_128 = (pointer)tests;
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).out_a,OUT,init);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  std::__cxx11::to_string((string *)&local_118,(this->pin_data).in_a);
  callback.flag = &event_callback_occurred;
  std::__cxx11::string::string((string *)&callback.target,(string *)local_118._M_pod_data);
  std::__cxx11::string::~string((string *)local_118._M_pod_data);
  get_saw_event.specify_callback = &specify_callback_local;
  get_saw_event.use_add_callback = &use_add_callback_local;
  iVar1 = (this->pin_data).in_a;
  get_saw_event.event_callback_occurred = &event_callback_occurred;
  get_saw_event.this = this;
  if (specify_callback_local == true) {
    GPIO::Callback::Callback<TestCallback&>((Callback *)&local_118,&callback);
    GPIO::add_event_detect(iVar1,edge,(Callback *)&local_118,0);
  }
  else {
    local_108 = 0;
    uStack_100 = 0;
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_f0 = 0;
    local_f8 = GPIO::details::CallbackCompare<void(std::__cxx11::string_const&)>::
               Compare<decltype(nullptr)>;
    local_e0 = std::
               _Function_handler<bool_(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&),_bool_(*)(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&)>
               ::_M_invoke;
    local_e8 = std::
               _Function_handler<bool_(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&),_bool_(*)(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&)>
               ::_M_manager;
    GPIO::add_event_detect(iVar1,edge,(Callback *)&local_118,0);
  }
  p_Var6 = &local_118;
  GPIO::Callback::~Callback((Callback *)p_Var6);
  uVar5 = (uint)p_Var6;
  if (use_add_callback_local == true) {
    iVar1 = (this->pin_data).in_a;
    GPIO::Callback::Callback<TestCallback&>((Callback *)&local_118,&callback);
    GPIO::add_event_callback(iVar1,(Callback *)&local_118);
    p_Var6 = &local_118;
    GPIO::Callback::~Callback((Callback *)p_Var6);
    uVar5 = (uint)p_Var6;
  }
  sleep(uVar5);
  bVar3 = _test_events::anon_class_32_4_ee1f9acd::operator()(&get_saw_event);
  std::__cxx11::string::string((string *)&local_90,"",(allocator *)local_118._M_pod_data);
  local_120 = this;
  assert::is_true(!bVar3,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  p_Var2 = (_Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
           &local_128->first;
  local_128 = (((_Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
               &local_128->first)->_M_impl).super__Vector_impl_data._M_finish;
  for (ppVar7 = (p_Var2->_M_impl).super__Vector_impl_data._M_start; ppVar7 != local_128;
      ppVar7 = ppVar7 + 1) {
    uVar5 = (local_120->pin_data).out_a;
    GPIO::output(uVar5,ppVar7->first);
    sleep(uVar5);
    bVar4 = _test_events::anon_class_32_4_ee1f9acd::operator()(&get_saw_event);
    bVar3 = ppVar7->second;
    std::__cxx11::string::string((string *)&local_50,"",(allocator *)local_118._M_pod_data);
    assert::is_true(bVar3 == bVar4,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    bVar3 = _test_events::anon_class_32_4_ee1f9acd::operator()(&get_saw_event);
    std::__cxx11::string::string((string *)&local_70,"",(allocator *)local_118._M_pod_data);
    assert::is_true(!bVar3,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  GPIO::remove_event_detect((local_120->pin_data).in_a);
  GPIO::cleanup();
  std::__cxx11::string::~string((string *)&callback.target);
  return;
}

Assistant:

void _test_events(int init, GPIO::Edge edge, const std::vector<std::pair<int, bool>>& tests, bool specify_callback,
                      bool use_add_callback)
    {
        bool event_callback_occurred = false;

        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, init);
        GPIO::setup(pin_data.in_a, GPIO::IN);

        TestCallback callback(&event_callback_occurred, std::to_string(pin_data.in_a));

        auto get_saw_event = [&]() mutable -> bool
        {
            if (specify_callback || use_add_callback)
            {
                bool val = event_callback_occurred;
                event_callback_occurred = false;
                return val;
            }

            return GPIO::event_detected(pin_data.in_a);
        };

        if (specify_callback)
            GPIO::add_event_detect(pin_data.in_a, edge, callback);
        else
            GPIO::add_event_detect(pin_data.in_a, edge);

        if (use_add_callback)
            GPIO::add_event_callback(pin_data.in_a, callback);

        sleep(0.1);
        assert::is_true(!get_saw_event());

        for (auto& pair : tests)
        {
            auto& output = pair.first;
            auto& event_expected = pair.second;

            GPIO::output(pin_data.out_a, output);
            sleep(0.1);
            assert::is_true(get_saw_event() == event_expected);
            assert::is_true(!get_saw_event());
        }

        GPIO::remove_event_detect(pin_data.in_a);
        GPIO::cleanup();
    }